

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie-pfx.c
# Opt level: O1

int pfx_table_node2pfx_record(trie_node *node,pfx_record *records,uint ary_len)

{
  long lVar1;
  uint *puVar2;
  long lVar3;
  undefined8 uVar4;
  uint uVar5;
  long lVar6;
  rtr_socket **pprVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = (uint *)node->data;
  uVar5 = 0xffffffff;
  if ((*puVar2 <= ary_len) && (uVar5 = *puVar2, uVar5 != 0)) {
    pprVar7 = &records->socket;
    lVar6 = 0;
    uVar8 = 0;
    do {
      ((pfx_record *)(pprVar7 + -4))->asn = *(uint32_t *)(*(long *)(puVar2 + 2) + lVar6);
      uVar4 = *(undefined8 *)((long)&(node->prefix).u + 4);
      *(undefined8 *)((long)pprVar7 + -0x1c) = *(undefined8 *)&node->prefix;
      *(undefined8 *)((long)pprVar7 + -0x14) = uVar4;
      *(uint32_t *)((long)pprVar7 + -0xc) = (node->prefix).u.addr6.addr[3];
      *(uint8_t *)(pprVar7 + -1) = node->len;
      lVar3 = *(long *)(puVar2 + 2);
      *(uint8_t *)((long)pprVar7 + -7) = *(uint8_t *)(lVar3 + 4 + lVar6);
      *pprVar7 = *(rtr_socket **)(lVar3 + 8 + lVar6);
      uVar8 = uVar8 + 1;
      uVar5 = *puVar2;
      lVar6 = lVar6 + 0x10;
      pprVar7 = pprVar7 + 5;
    } while (uVar8 < uVar5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return uVar5;
  }
  __stack_chk_fail();
}

Assistant:

int pfx_table_node2pfx_record(struct trie_node *node, struct pfx_record *records, const unsigned int ary_len)
{
	struct node_data *data = node->data;

	if (ary_len < data->len)
		return PFX_ERROR;

	for (unsigned int i = 0; i < data->len; i++) {
		records[i].asn = data->ary[i].asn;
		records[i].prefix = node->prefix;
		records[i].min_len = node->len;
		records[i].max_len = data->ary[i].max_len;
		records[i].socket = data->ary[i].socket;
	}
	return data->len;
}